

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_cloud.hpp
# Opt level: O0

Result __thiscall
ruckig::WaypointsCalculator<1UL,_ruckig::StandardVector>::calculate<true>
          (WaypointsCalculator<1UL,_ruckig::StandardVector> *this,
          InputParameter<1UL,_ruckig::StandardVector> *input,
          Trajectory<1UL,_ruckig::StandardVector> *traj,double param_3,bool *was_interrupted)

{
  size_t sVar1;
  bool bVar2;
  ostream *poVar3;
  reference pvVar4;
  vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_> *pvVar5;
  array<double,_1UL> *paVar6;
  array<ruckig::ControlInterface,_1UL> *vector;
  array<ruckig::Synchronization,_1UL> *vector_00;
  double *val;
  vector<double,_std::allocator<double>_> *vector_01;
  const_reference pvVar7;
  size_type sVar8;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar9;
  reference this_00;
  reference __dest;
  double dVar10;
  Profile local_330;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_f0;
  value_type *p;
  size_t dof;
  size_t i;
  vector<double,_std::allocator<double>_> local_d0;
  undefined1 local_b8 [8];
  json result;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_88;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_78 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_58;
  undefined1 local_48 [8];
  json params;
  bool *was_interrupted_local;
  double param_3_local;
  Trajectory<1UL,_ruckig::StandardVector> *traj_local;
  InputParameter<1UL,_ruckig::StandardVector> *input_local;
  WaypointsCalculator<1UL,_ruckig::StandardVector> *this_local;
  
  params.m_data.m_value = (json_value)was_interrupted;
  poVar3 = std::operator<<((ostream *)&std::cout,"[ruckig] calculate trajectory via cloud API.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_48,(nullptr_t)0x0);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<const_unsigned_long_&,_unsigned_long,_0>(&local_58,&input->degrees_of_freedom);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"degrees_of_freedom");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(pvVar4,&local_58);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(&local_58);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"current_position");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
            (pvVar4,&input->current_position);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"current_velocity");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
            (pvVar4,&input->current_velocity);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"current_acceleration");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
            (pvVar4,&input->current_acceleration);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"target_position");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
            (pvVar4,&input->target_position);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"target_velocity");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
            (pvVar4,&input->target_velocity);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"target_acceleration");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
            (pvVar4,&input->target_acceleration);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"max_velocity");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
            (pvVar4,&input->max_velocity);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"max_acceleration");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
            (pvVar4,&input->max_acceleration);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"max_jerk");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
            (pvVar4,&input->max_jerk);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->min_velocity);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"min_velocity");
    paVar6 = std::optional<std::array<double,_1UL>_>::value(&input->min_velocity);
    WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
              (pvVar4,paVar6);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->min_acceleration);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"min_acceleration");
    paVar6 = std::optional<std::array<double,_1UL>_>::value(&input->min_acceleration);
    WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
              (pvVar4,paVar6);
  }
  bVar2 = std::vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>::empty
                    (&input->intermediate_positions);
  if (!bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"intermediate_positions");
    WaypointsCalculator<1ul,ruckig::StandardVector>::double_vector_to_json<std::array<double,1ul>>
              (pvVar4,&input->intermediate_positions);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->per_section_max_velocity);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"per_section_max_velocity");
    pvVar5 = std::
             optional<std::vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>_>
             ::value(&input->per_section_max_velocity);
    WaypointsCalculator<1ul,ruckig::StandardVector>::double_vector_to_json<std::array<double,1ul>>
              (pvVar4,pvVar5);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->per_section_max_acceleration);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"per_section_max_acceleration");
    pvVar5 = std::
             optional<std::vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>_>
             ::value(&input->per_section_max_acceleration);
    WaypointsCalculator<1ul,ruckig::StandardVector>::double_vector_to_json<std::array<double,1ul>>
              (pvVar4,pvVar5);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->per_section_max_jerk);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"per_section_max_jerk");
    pvVar5 = std::
             optional<std::vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>_>
             ::value(&input->per_section_max_jerk);
    WaypointsCalculator<1ul,ruckig::StandardVector>::double_vector_to_json<std::array<double,1ul>>
              (pvVar4,pvVar5);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->per_section_min_velocity);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"per_section_min_velocity");
    pvVar5 = std::
             optional<std::vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>_>
             ::value(&input->per_section_min_velocity);
    WaypointsCalculator<1ul,ruckig::StandardVector>::double_vector_to_json<std::array<double,1ul>>
              (pvVar4,pvVar5);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->per_section_min_acceleration);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"per_section_min_acceleration");
    pvVar5 = std::
             optional<std::vector<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>_>
             ::value(&input->per_section_min_acceleration);
    WaypointsCalculator<1ul,ruckig::StandardVector>::double_vector_to_json<std::array<double,1ul>>
              (pvVar4,pvVar5);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->max_position);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"max_position");
    paVar6 = std::optional<std::array<double,_1UL>_>::value(&input->max_position);
    WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
              (pvVar4,paVar6);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->min_position);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"min_position");
    paVar6 = std::optional<std::array<double,_1UL>_>::value(&input->min_position);
    WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<double,1ul>>
              (pvVar4,paVar6);
  }
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"enabled");
  WaypointsCalculator<1ul,ruckig::StandardVector>::vector_to_json<std::array<bool,1ul>>
            (pvVar4,&input->enabled);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<const_ruckig::ControlInterface_&,_ruckig::ControlInterface,_0>
            (local_78,&input->control_interface);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"control_interface");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(pvVar4,local_78);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(local_78);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<const_ruckig::Synchronization_&,_ruckig::Synchronization,_0>
            (&local_88,&input->synchronization);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"synchronization");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(pvVar4,&local_88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(&local_88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<const_ruckig::DurationDiscretization_&,_ruckig::DurationDiscretization,_0>
            (&local_98,&input->duration_discretization);
  pvVar4 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_48,"duration_discretization");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(pvVar4,&local_98);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(&local_98);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->per_dof_control_interface);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"per_dof_control_interface");
    vector = std::optional<std::array<ruckig::ControlInterface,_1UL>_>::value
                       (&input->per_dof_control_interface);
    WaypointsCalculator<1ul,ruckig::StandardVector>::
    vector_to_json<std::array<ruckig::ControlInterface,1ul>>(pvVar4,vector);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->per_dof_synchronization);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"per_dof_synchronization");
    vector_00 = std::optional<std::array<ruckig::Synchronization,_1UL>_>::value
                          (&input->per_dof_synchronization);
    WaypointsCalculator<1ul,ruckig::StandardVector>::
    vector_to_json<std::array<ruckig::Synchronization,1ul>>(pvVar4,vector_00);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->minimum_duration);
  if (bVar2) {
    val = std::optional<double>::value(&input->minimum_duration);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<const_double_&,_double,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&result.m_data.m_value,val);
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"minimum_duration");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=(pvVar4,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&result.m_data.m_value);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&result.m_data.m_value);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&input->per_section_minimum_duration);
  if (bVar2) {
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_48,"per_section_minimum_duration");
    vector_01 = std::optional<std::vector<double,_std::allocator<double>_>_>::value
                          (&input->per_section_minimum_duration);
    WaypointsCalculator<1ul,ruckig::StandardVector>::
    vector_to_json<std::vector<double,std::allocator<double>>>(pvVar4,vector_01);
  }
  ruckig::CloudClient::post((basic_json *)local_b8,SUB81(this,0));
  (params.m_data.m_value.string)->_M_dataplus = (_Alloc_hider)0x0;
  traj->degrees_of_freedom = input->degrees_of_freedom;
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_b8,"profiles");
  sVar8 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::size(pvVar7);
  Trajectory<1UL,_ruckig::StandardVector>::resize<1UL,_0>(traj,sVar8 - 1);
  traj->continue_calculation_counter = 0;
  pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)local_b8,"duration");
  dVar10 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::get<double,double>(pbVar9);
  traj->duration = dVar10;
  pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)local_b8,"cumulative_times");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::get<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
            (&local_d0,pbVar9);
  std::vector<double,_std::allocator<double>_>::operator=(&traj->cumulative_times,&local_d0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_d0);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_b8,"message");
  bVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::empty(pvVar7);
  if (!bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ruckig] ");
    pvVar7 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_b8,"message");
    poVar3 = nlohmann::json_abi_v3_11_3::operator<<(poVar3,pvVar7);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_b8,"result");
  bVar2 = nlohmann::json_abi_v3_11_3::operator==<const_char_*,_0>(pvVar7,"Result.Error");
  if (bVar2) {
    this_local._4_4_ = Error;
  }
  else {
    pvVar7 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_b8,"result");
    bVar2 = nlohmann::json_abi_v3_11_3::operator==<const_char_*,_0>
                      (pvVar7,"Result.ErrorInvalidInput");
    if (bVar2) {
      this_local._4_4_ = ErrorInvalidInput;
    }
    else {
      dof = 0;
      while( true ) {
        sVar1 = dof;
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)local_b8,"profiles");
        sVar8 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::size(pvVar7);
        if (sVar8 <= sVar1) break;
        for (p = (value_type *)0x0; p < (value_type *)traj->degrees_of_freedom;
            p = (value_type *)&(p->m_data).field_0x1) {
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)local_b8,"profiles");
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pvVar7,dof);
          local_f0 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      *)nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator[](pvVar7,(size_type)p);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::get<ruckig::Profile,ruckig::Profile>(&local_330,local_f0);
          this_00 = std::
                    vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                    ::operator[](&traj->profiles,dof);
          __dest = std::array<ruckig::Profile,_1UL>::operator[](this_00,(size_type)p);
          memcpy(__dest,&local_330,0x23c);
        }
        dof = dof + 1;
      }
      this_local._4_4_ = Working;
    }
  }
  i._4_4_ = 1;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)local_b8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)local_48);
  return this_local._4_4_;
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& input, Trajectory<DOFs, CustomVector>& traj, double, bool& was_interrupted) {
        std::cout << "[ruckig] calculate trajectory via cloud API." << std::endl;

        nlohmann::json params;
        params["degrees_of_freedom"] = input.degrees_of_freedom;
        vector_to_json<Vector<double>>(params["current_position"], input.current_position);
        vector_to_json<Vector<double>>(params["current_velocity"], input.current_velocity);
        vector_to_json<Vector<double>>(params["current_acceleration"], input.current_acceleration);
        vector_to_json<Vector<double>>(params["target_position"], input.target_position);
        vector_to_json<Vector<double>>(params["target_velocity"], input.target_velocity);
        vector_to_json<Vector<double>>(params["target_acceleration"], input.target_acceleration);
        vector_to_json<Vector<double>>(params["max_velocity"], input.max_velocity);
        vector_to_json<Vector<double>>(params["max_acceleration"], input.max_acceleration);
        vector_to_json<Vector<double>>(params["max_jerk"], input.max_jerk);
        if (input.min_velocity) {
            vector_to_json<Vector<double>>(params["min_velocity"], input.min_velocity.value());
        }
        if (input.min_acceleration) {
            vector_to_json<Vector<double>>(params["min_acceleration"], input.min_acceleration.value());
        }
        if (!input.intermediate_positions.empty()) {
            double_vector_to_json<Vector<double>>(params["intermediate_positions"], input.intermediate_positions);
        }
        if (input.per_section_max_velocity) {
            double_vector_to_json<Vector<double>>(params["per_section_max_velocity"], input.per_section_max_velocity.value());
        }
        if (input.per_section_max_acceleration) {
            double_vector_to_json<Vector<double>>(params["per_section_max_acceleration"], input.per_section_max_acceleration.value());
        }
        if (input.per_section_max_jerk) {
            double_vector_to_json<Vector<double>>(params["per_section_max_jerk"], input.per_section_max_jerk.value());
        }
        if (input.per_section_min_velocity) {
            double_vector_to_json<Vector<double>>(params["per_section_min_velocity"], input.per_section_min_velocity.value());
        }
        if (input.per_section_min_acceleration) {
            double_vector_to_json<Vector<double>>(params["per_section_min_acceleration"], input.per_section_min_acceleration.value());
        }
        if (input.max_position) {
            vector_to_json<Vector<double>>(params["max_position"], input.max_position.value());
        }
        if (input.min_position) {
            vector_to_json<Vector<double>>(params["min_position"], input.min_position.value());
        }
        vector_to_json<Vector<bool>>(params["enabled"], input.enabled);
        params["control_interface"] = input.control_interface;
        params["synchronization"] = input.synchronization;
        params["duration_discretization"] = input.duration_discretization;
        if (input.per_dof_control_interface) {
            vector_to_json<Vector<ControlInterface>>(params["per_dof_control_interface"], input.per_dof_control_interface.value());
        }
        if (input.per_dof_synchronization) {
            vector_to_json<Vector<Synchronization>>(params["per_dof_synchronization"], input.per_dof_synchronization.value());
        }
        if (input.minimum_duration) {
            params["minimum_duration"] = input.minimum_duration.value();
        }
        if (input.per_section_minimum_duration) {
            vector_to_json<std::vector<double>>(params["per_section_minimum_duration"], input.per_section_minimum_duration.value());
        }

        const auto result = client.post(params, throw_error);

        was_interrupted = false;
        traj.degrees_of_freedom = input.degrees_of_freedom;
        traj.resize(result["profiles"].size() - 1);

        traj.continue_calculation_counter = 0;
        traj.duration = result["duration"].template get<double>();
        traj.cumulative_times = result["cumulative_times"].template get<std::vector<double>>();

        if (!result["message"].empty()) {
            std::cout << "[ruckig] " << result["message"] << std::endl;
        }

        if (result["result"] == "Result.Error") {
            return Result::Error;

        } else if (result["result"] == "Result.ErrorInvalidInput") {
            return Result::ErrorInvalidInput;
        }

        for (size_t i = 0; i < result["profiles"].size(); ++i) {
            for (size_t dof = 0; dof < traj.degrees_of_freedom; ++dof) {
                auto& p = result["profiles"][i][dof];
                traj.profiles[i][dof] = p.template get<Profile>();
            }
        }

        return Result::Working;
    }